

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_avx512_mula2(uint16_t *data,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int j;
  long lVar4;
  ulong uVar5;
  undefined1 (*pauVar6) [16];
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar38 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  auVar8 = in_ZMM16._0_16_;
  pauVar6 = (undefined1 (*) [16])local_480;
  uVar7 = 0;
  memset(local_480,0,0x400);
  if (len < 0x40) {
    auVar8 = vpxord_avx512vl(auVar8,auVar8);
    auVar38 = ZEXT1664(auVar8);
  }
  else {
    auVar33 = vmovdqa64_avx512f(local_440);
    auVar34 = vmovdqa64_avx512f(local_400);
    auVar35 = vmovdqa64_avx512f(local_3c0);
    auVar36 = vmovdqa64_avx512f(local_380);
    auVar9 = vmovdqa64_avx512f(local_340);
    auVar10 = vmovdqa64_avx512f(local_300);
    auVar11 = vmovdqa64_avx512f(local_2c0);
    auVar12 = vmovdqa64_avx512f(local_280);
    auVar13 = vmovdqa64_avx512f(local_180);
    auVar14 = vmovdqa64_avx512f(local_240);
    auVar15 = vmovdqa64_avx512f(local_140);
    auVar16 = vmovdqa64_avx512f(local_200);
    auVar17 = vmovdqa64_avx512f(local_100);
    auVar18 = vmovdqa64_avx512f(local_1c0);
    auVar37 = ZEXT1664((undefined1  [16])0x0);
    uVar5 = 2;
    auVar19 = vmovdqa64_avx512f(local_c0);
    uVar7 = 0;
    auVar20 = vmovdqa64_avx512f(_DAT_00117280);
    auVar21 = vmovdqa64_avx512f(_DAT_001172c0);
    auVar22 = vpbroadcastb_avx512bw(ZEXT116(0x11));
    auVar23 = vpbroadcastq_avx512f(ZEXT816(0xf));
    auVar8 = vpxord_avx512vl(auVar8,auVar8);
    auVar38 = ZEXT1664(auVar8);
    do {
      auVar24 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar7));
      auVar25 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar7 + 0x20));
      auVar26 = vmovdqa64_avx512f(auVar24);
      auVar26 = vpermt2b_avx512_vbmi(auVar26,auVar20,auVar25);
      auVar24 = vpermt2b_avx512_vbmi(auVar25,auVar21,auVar24);
      auVar25 = vpsrld_avx512f(auVar26,1);
      auVar27 = vpsrld_avx512f(auVar26,2);
      auVar28 = vpsrld_avx512f(auVar26,3);
      auVar29 = vpsrld_avx512f(auVar24,1);
      auVar30 = vpsrld_avx512f(auVar24,2);
      auVar31 = vpsrld_avx512f(auVar24,3);
      auVar26 = vpandq_avx512f(auVar26,auVar22);
      auVar26 = vpsadbw_avx512bw(auVar26,auVar37);
      auVar25 = vpandq_avx512f(auVar25,auVar22);
      auVar25 = vpsadbw_avx512bw(auVar25,auVar37);
      auVar27 = vpandq_avx512f(auVar27,auVar22);
      auVar27 = vpsadbw_avx512bw(auVar27,auVar37);
      auVar28 = vpandq_avx512f(auVar28,auVar22);
      auVar28 = vpsadbw_avx512bw(auVar28,auVar37);
      auVar24 = vpandq_avx512f(auVar24,auVar22);
      auVar24 = vpsadbw_avx512bw(auVar24,auVar37);
      auVar29 = vpandq_avx512f(auVar29,auVar22);
      auVar29 = vpsadbw_avx512bw(auVar29,auVar37);
      auVar30 = vpandq_avx512f(auVar30,auVar22);
      auVar30 = vpsadbw_avx512bw(auVar30,auVar37);
      auVar31 = vpandq_avx512f(auVar31,auVar22);
      auVar31 = vpsadbw_avx512bw(auVar31,auVar37);
      auVar32 = vpandq_avx512f(auVar26,auVar23);
      auVar38 = vpaddq_avx512f(auVar38,auVar32);
      auVar26 = vpsrld_avx512f(auVar26,4);
      auVar36 = vpaddq_avx512f(auVar36,auVar26);
      auVar26 = vpandq_avx512f(auVar25,auVar23);
      auVar33 = vpaddq_avx512f(auVar33,auVar26);
      auVar25 = vpsrld_avx512f(auVar25,4);
      auVar9 = vpaddq_avx512f(auVar9,auVar25);
      auVar25 = vpandq_avx512f(auVar27,auVar23);
      auVar34 = vpaddq_avx512f(auVar34,auVar25);
      auVar25 = vpsrld_avx512f(auVar27,4);
      auVar10 = vpaddq_avx512f(auVar10,auVar25);
      auVar25 = vpandq_avx512f(auVar28,auVar23);
      auVar35 = vpaddq_avx512f(auVar35,auVar25);
      auVar25 = vpsrld_avx512f(auVar28,4);
      auVar11 = vpaddq_avx512f(auVar11,auVar25);
      auVar25 = vpandq_avx512f(auVar24,auVar23);
      auVar12 = vpaddq_avx512f(auVar12,auVar25);
      auVar24 = vpsrld_avx512f(auVar24,4);
      auVar13 = vpaddq_avx512f(auVar13,auVar24);
      auVar24 = vpandq_avx512f(auVar29,auVar23);
      auVar14 = vpaddq_avx512f(auVar14,auVar24);
      auVar24 = vpsrld_avx512f(auVar29,4);
      auVar15 = vpaddq_avx512f(auVar15,auVar24);
      auVar24 = vpandq_avx512f(auVar30,auVar23);
      auVar16 = vpaddq_avx512f(auVar16,auVar24);
      auVar24 = vpsrld_avx512f(auVar30,4);
      auVar17 = vpaddq_avx512f(auVar17,auVar24);
      auVar24 = vpandq_avx512f(auVar31,auVar23);
      auVar18 = vpaddq_avx512f(auVar18,auVar24);
      auVar24 = vpsrld_avx512f(auVar31,4);
      auVar19 = vpaddq_avx512f(auVar19,auVar24);
      uVar5 = uVar5 + 2;
      uVar7 = uVar7 + 0x40;
    } while (uVar5 <= len >> 5);
    local_380 = vmovdqa64_avx512f(auVar36);
    local_440 = vmovdqa64_avx512f(auVar33);
    local_340 = vmovdqa64_avx512f(auVar9);
    local_400 = vmovdqa64_avx512f(auVar34);
    local_300 = vmovdqa64_avx512f(auVar10);
    local_3c0 = vmovdqa64_avx512f(auVar35);
    local_2c0 = vmovdqa64_avx512f(auVar11);
    local_280 = vmovdqa64_avx512f(auVar12);
    local_180 = vmovdqa64_avx512f(auVar13);
    local_240 = vmovdqa64_avx512f(auVar14);
    local_140 = vmovdqa64_avx512f(auVar15);
    local_200 = vmovdqa64_avx512f(auVar16);
    local_100 = vmovdqa64_avx512f(auVar17);
    local_1c0 = vmovdqa64_avx512f(auVar18);
    local_c0 = vmovdqa64_avx512f(auVar19);
  }
  local_480 = vmovdqa64_avx512f(auVar38);
  lVar4 = 0;
  do {
    auVar8 = vpaddq_avx(pauVar6[3],pauVar6[2]);
    auVar2 = vpshufd_avx(auVar8,0xee);
    auVar1 = vpaddq_avx(pauVar6[1],*pauVar6);
    auVar3 = vpshufd_avx(auVar1,0xee);
    auVar1 = vpaddq_avx(auVar1,auVar3);
    auVar8 = vpaddq_avx(auVar8,auVar2);
    flags[lVar4] = auVar8._0_4_ + auVar1._0_4_;
    lVar4 = lVar4 + 1;
    pauVar6 = pauVar6 + 4;
  } while (lVar4 != 0x10);
  if (uVar7 < len) {
    auVar33 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar34 = vpmovsxbd_avx512f(_DAT_00116080);
    auVar35 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar36 = vpbroadcastd_avx512f();
      auVar36 = vpsrlvd_avx512f(auVar36,auVar34);
      auVar36 = vpandd_avx512f(auVar36,auVar35);
      auVar33 = vpaddd_avx512f(auVar36,auVar33);
      uVar7 = uVar7 + 1;
    } while (len != uVar7);
    auVar33 = vmovdqu64_avx512f(auVar33);
    *(undefined1 (*) [64])flags = auVar33;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512_mula2(const uint16_t* data, uint32_t len, uint32_t* flags) {
    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

    __m512i sum[16];
    for (int i=0; i < 16; ++i)
        sum[i] = _mm512_setzero_si512();

    size_t i = 0;
    for (/**/; i + 2 <= n_cycles; i += 2) {
        __m512i v0 = _mm512_loadu_si512(data_vectors + i);
        __m512i v1 = _mm512_loadu_si512(data_vectors + i + 1);

        __m512i input0 = _mm512_or_si512(_mm512_and_si512(v0, _mm512_set1_epi16(0x00FF)), _mm512_slli_epi16(v1, 8));
        __m512i input1 = _mm512_or_si512(_mm512_and_si512(v0, _mm512_set1_epi16((int16_t)0xFF00)), _mm512_srli_epi16(v1, 8));
        
        const __m512i bits_04 = _mm512_and_si512(input0, _mm512_set1_epi16(0x1111));
        const __m512i bits_15 = _mm512_and_si512(_mm512_srli_epi32(input0, 1), _mm512_set1_epi16(0x1111)); // 00010001 00010001
        const __m512i bits_26 = _mm512_and_si512(_mm512_srli_epi32(input0, 2), _mm512_set1_epi16(0x1111));
        const __m512i bits_37 = _mm512_and_si512(_mm512_srli_epi32(input0, 3), _mm512_set1_epi16(0x1111));

        const __m512i bits_8c = _mm512_and_si512(input1, _mm512_set1_epi16(0x1111));
        const __m512i bits_9d = _mm512_and_si512(_mm512_srli_epi32(input1, 1), _mm512_set1_epi16(0x1111));
        const __m512i bits_ae = _mm512_and_si512(_mm512_srli_epi32(input1, 2), _mm512_set1_epi16(0x1111));
        const __m512i bits_bf = _mm512_and_si512(_mm512_srli_epi32(input1, 3), _mm512_set1_epi16(0x1111));

        const __m512i sum_04 = _mm512_sad_epu8(bits_04, _mm512_setzero_si512());
        const __m512i sum_15 = _mm512_sad_epu8(bits_15, _mm512_setzero_si512());
        const __m512i sum_26 = _mm512_sad_epu8(bits_26, _mm512_setzero_si512());
        const __m512i sum_37 = _mm512_sad_epu8(bits_37, _mm512_setzero_si512());

        const __m512i sum_8c = _mm512_sad_epu8(bits_8c, _mm512_setzero_si512());
        const __m512i sum_9d = _mm512_sad_epu8(bits_9d, _mm512_setzero_si512());
        const __m512i sum_ae = _mm512_sad_epu8(bits_ae, _mm512_setzero_si512());
        const __m512i sum_bf = _mm512_sad_epu8(bits_bf, _mm512_setzero_si512());

        sum[0x0] = _mm512_add_epi64(sum[0x0], _mm512_and_si512 (sum_04, _mm512_set1_epi64(0xF))); // 00001111
        sum[0x4] = _mm512_add_epi64(sum[0x4], _mm512_srli_epi32(sum_04, 4));
        sum[0x1] = _mm512_add_epi64(sum[0x1], _mm512_and_si512 (sum_15, _mm512_set1_epi64(0xF)));
        sum[0x5] = _mm512_add_epi64(sum[0x5], _mm512_srli_epi32(sum_15, 4));
        sum[0x2] = _mm512_add_epi64(sum[0x2], _mm512_and_si512 (sum_26, _mm512_set1_epi64(0xF)));
        sum[0x6] = _mm512_add_epi64(sum[0x6], _mm512_srli_epi32(sum_26, 4));
        sum[0x3] = _mm512_add_epi64(sum[0x3], _mm512_and_si512 (sum_37, _mm512_set1_epi64(0xF)));
        sum[0x7] = _mm512_add_epi64(sum[0x7], _mm512_srli_epi32(sum_37, 4));
        sum[0x8] = _mm512_add_epi64(sum[0x8], _mm512_and_si512 (sum_8c, _mm512_set1_epi64(0xF)));
        sum[0xc] = _mm512_add_epi64(sum[0xc], _mm512_srli_epi32(sum_8c, 4));
        sum[0x9] = _mm512_add_epi64(sum[0x9], _mm512_and_si512 (sum_9d, _mm512_set1_epi64(0xF)));
        sum[0xd] = _mm512_add_epi64(sum[0xd], _mm512_srli_epi32(sum_9d, 4));
        sum[0xa] = _mm512_add_epi64(sum[0xa], _mm512_and_si512 (sum_ae, _mm512_set1_epi64(0xF)));
        sum[0xe] = _mm512_add_epi64(sum[0xe], _mm512_srli_epi32(sum_ae, 4));
        sum[0xb] = _mm512_add_epi64(sum[0xb], _mm512_and_si512 (sum_bf, _mm512_set1_epi64(0xF)));
        sum[0xf] = _mm512_add_epi64(sum[0xf], _mm512_srli_epi32(sum_bf, 4));
    }

    for (int j = 0; j < 16; ++j) {
        const __m128i dq0 = _mm512_extracti32x4_epi32(sum[j], 0);
        const __m128i dq1 = _mm512_extracti32x4_epi32(sum[j], 1);
        const __m128i dq2 = _mm512_extracti32x4_epi32(sum[j], 2);
        const __m128i dq3 = _mm512_extracti32x4_epi32(sum[j], 3);
        flags[j] = _mm_extract_epi64(dq0, 0)
                    + _mm_extract_epi64(dq0, 1)
                    + _mm_extract_epi64(dq1, 0)
                    + _mm_extract_epi64(dq1, 1)
                    + _mm_extract_epi64(dq2, 0)
                    + _mm_extract_epi64(dq2, 1)
                    + _mm_extract_epi64(dq3, 0)
                    + _mm_extract_epi64(dq3, 1);
    }

    i *= 32;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((data[i] & (1 << j)) >> j);
        }
    }

    return 0;
}